

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadPool.cpp
# Opt level: O3

void __thiscall gnl::ThreadPool::finish(ThreadPool *this)

{
  pointer psVar1;
  unique_lock<std::mutex> lock;
  unique_lock<std::mutex> local_28;
  
  if ((this->taskQueue).
      super__Deque_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>._M_impl.
      super__Deque_impl_data._M_finish._M_cur !=
      (this->taskQueue).
      super__Deque_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>._M_impl.
      super__Deque_impl_data._M_start._M_cur) {
    do {
      usleep(100);
    } while ((this->taskQueue).
             super__Deque_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>.
             _M_impl.super__Deque_impl_data._M_finish._M_cur !=
             (this->taskQueue).
             super__Deque_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>.
             _M_impl.super__Deque_impl_data._M_start._M_cur);
  }
  local_28._M_device = &this->mu;
  local_28._M_owns = false;
  std::unique_lock<std::mutex>::lock(&local_28);
  local_28._M_owns = true;
  this->running = false;
  std::condition_variable::notify_all();
  std::unique_lock<std::mutex>::~unique_lock(&local_28);
  for (psVar1 = (this->threads).
                super__Vector_base<std::shared_ptr<std::thread>,_std::allocator<std::shared_ptr<std::thread>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      psVar1 != (this->threads).
                super__Vector_base<std::shared_ptr<std::thread>,_std::allocator<std::shared_ptr<std::thread>_>_>
                ._M_impl.super__Vector_impl_data._M_finish; psVar1 = psVar1 + 1) {
    std::thread::join();
  }
  return;
}

Assistant:

void ThreadPool::finish()
{
	while(!taskQueue.empty()){
		//缓冲队列还有任务，则等待执行完成
		usleep(100);	//休眠100毫秒
	}
	{
		std::unique_lock<std::mutex> lock(mu);
		running = false;
		empty.notify_all();		//唤醒所有线程
	}
	//等待每一个线程退出
	for(std::vector<std::shared_ptr<std::thread>>::iterator i = threads.begin();
					i != threads.end(); ++i)
	{
		(*i)->join();
	}

}